

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O2

void __thiscall arm::MemoryOperand::display(MemoryOperand *this,ostream *o)

{
  MemoryAccessKind MVar1;
  char *pcVar2;
  anon_class_8_1_8991fb9c display_offset;
  anon_class_8_1_8991fb9c local_18;
  
  local_18.this = this;
  std::operator<<(o,"[");
  display_reg_name(o,this->r1);
  MVar1 = this->kind;
  if (MVar1 == PostIndex) {
    std::operator<<(o,", ");
    display::anon_class_8_1_8991fb9c::operator()(&local_18,o);
    pcVar2 = "]!";
LAB_0018ebd4:
    std::operator<<(o,pcVar2);
    return;
  }
  if (MVar1 == PreIndex) {
    std::operator<<(o,"], ");
    display::anon_class_8_1_8991fb9c::operator()(&local_18,o);
  }
  else if (MVar1 == None) {
    std::operator<<(o,", ");
    display::anon_class_8_1_8991fb9c::operator()(&local_18,o);
    pcVar2 = "]";
    goto LAB_0018ebd4;
  }
  return;
}

Assistant:

void MemoryOperand::display(std::ostream &o) const {
  auto display_offset = [&](std::ostream &o) {
    if (auto x = std::get_if<RegisterOperand>(&offset)) {
      if (neg_rm) o << "-";
      o << *x;
    } else if (auto x = std::get_if<int16_t>(&offset)) {
      o << "#" << *x;
    }
  };
  o << "[";
  display_reg_name(o, r1);
  switch (kind) {
    case MemoryAccessKind::None:
      o << ", ";
      display_offset(o);
      o << "]";
      break;
    case MemoryAccessKind::PostIndex:
      o << ", ";
      display_offset(o);
      o << "]!";
      break;
    case MemoryAccessKind::PreIndex:
      o << "], ";
      display_offset(o);
      break;
  }
}